

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::member_attribute_qualifier_abi_cxx11_
          (CompilerMSL *this,SPIRType *type,uint32_t index)

{
  BuiltIn BVar1;
  bool bVar2;
  uint32_t uVar3;
  TypedID *this_00;
  size_type sVar4;
  CompilerError *pCVar5;
  TypedID<(spirv_cross::Types)1> *pTVar6;
  SPIRType *pSVar7;
  ulong uVar8;
  uint in_ECX;
  undefined4 in_register_00000014;
  BuiltIn builtin_00;
  bool local_a31;
  bool local_9ee;
  bool local_995;
  byte local_8a2;
  byte local_8a1;
  allocator local_82a;
  allocator local_829;
  undefined1 local_828 [40];
  string local_800 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0 [35];
  allocator local_7bd;
  uint32_t local_7bc;
  uint32_t local_7b8;
  uint32_t local_7b4;
  uint32_t local_7b0;
  uint32_t local_7ac;
  uint32_t local_7a8;
  allocator local_7a1;
  uint32_t local_7a0;
  allocator local_799;
  uint32_t locn_3;
  allocator local_771;
  string local_770 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750 [39];
  allocator local_729;
  undefined1 local_728 [40];
  string local_700 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0 [39];
  allocator local_6b9;
  string local_6b8 [36];
  uint32_t local_694;
  uint32_t local_690;
  uint32_t local_68c;
  uint32_t local_688;
  uint32_t local_684;
  uint32_t local_680;
  uint32_t local_67c;
  undefined1 local_678 [48];
  undefined1 local_648 [40];
  string quals_1;
  spirv_cross local_608 [39];
  allocator local_5e1;
  string local_5e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0 [32];
  uint32_t local_5a0;
  allocator local_599;
  uint32_t locn_2;
  allocator local_592;
  allocator local_591;
  undefined1 local_590 [40];
  string local_568 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548 [39];
  allocator local_521;
  spirv_cross local_520 [39];
  allocator local_4f9;
  string local_4f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8 [32];
  uint32_t local_4b8;
  allocator local_4b2;
  allocator local_4b1;
  uint32_t locn_1;
  allocator local_489;
  string local_488 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448 [39];
  allocator local_421;
  undefined1 local_420 [40];
  string local_3f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8 [34];
  allocator local_396;
  allocator local_395;
  uint local_394;
  undefined1 local_390 [8];
  string loc_qual;
  allocator local_369;
  undefined1 local_368 [40];
  string local_340 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300 [36];
  uint32_t local_2dc;
  uint32_t local_2d8;
  uint32_t local_2d4;
  undefined1 local_2d0 [40];
  string local_2a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268 [36];
  uint32_t local_244;
  uint32_t local_240;
  uint32_t local_23c;
  undefined1 local_238 [40];
  string local_210 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0 [36];
  byte local_1ac;
  allocator local_1ab;
  byte local_1aa;
  byte local_1a9;
  undefined1 local_1a8 [40];
  string local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [39];
  byte local_139;
  spirv_cross local_138 [7];
  bool use_semantic_stage_output;
  allocator local_111;
  string local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  uint32_t local_d0;
  allocator local_c9;
  uint32_t locn;
  allocator local_a1;
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [35];
  allocator local_5d [13];
  uint32_t local_50;
  AddressingModel local_4c;
  undefined1 local_46;
  undefined1 local_45;
  BuiltIn local_44;
  bool is_builtin;
  SPIRType *pSStack_40;
  BuiltIn builtin;
  SPIRType *mbr_type;
  SPIRFunction *pSStack_30;
  uint32_t mbr_type_id;
  SPIREntryPoint *execution;
  AlignedBuffer<unsigned_char,_8UL> AStack_20;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  string *quals;
  
  AStack_20.aligned_char._4_4_ = in_register_00000014;
  AStack_20.aligned_char._0_4_ = index;
  execution._4_4_ = in_ECX;
  type_local = type;
  this_local = this;
  pSStack_30 = (SPIRFunction *)Compiler::get_entry_point((Compiler *)type);
  this_00 = (TypedID *)
            VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                      ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                       ((long)AStack_20.aligned_char + 0x98),(ulong)execution._4_4_);
  mbr_type._4_4_ = TypedID::operator_cast_to_unsigned_int(this_00);
  pSStack_40 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,mbr_type._4_4_);
  local_44 = BuiltInMax;
  local_45 = Compiler::is_member_builtin
                       ((Compiler *)type,(SPIRType *)AStack_20.aligned_char,execution._4_4_,
                        &local_44);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)AStack_20.aligned_char + 8));
  bVar2 = Compiler::has_extended_member_decoration
                    ((Compiler *)type,uVar3,execution._4_4_,SPIRVCrossDecorationResourceIndexPrimary
                    );
  BVar1 = local_44;
  if (bVar2) {
    local_46 = MemoryModelSimple >> 0x10;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)AStack_20.aligned_char + 8));
    local_4c = Compiler::get_extended_member_decoration
                         ((Compiler *)type,uVar3,execution._4_4_,
                          SPIRVCrossDecorationResourceIndexPrimary);
    join<char_const(&)[7],unsigned_int,char_const(&)[2]>
              ((spirv_cross *)this,(char (*) [7])" [[id(",&local_4c,(char (*) [2])0x40bd22);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)AStack_20.aligned_char + 8));
    local_50 = Compiler::get_extended_member_decoration
                         ((Compiler *)type,uVar3,execution._4_4_,SPIRVCrossDecorationInterfaceOrigID
                         );
    sVar4 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)(type[8].member_type_index_redirection.stack_storage.aligned_char + 8),
                    &local_50);
    if (sVar4 != 0) {
      ::std::__cxx11::string::operator+=((string *)this,", raster_order_group(0)");
    }
    ::std::__cxx11::string::operator+=((string *)this,"]]");
    return this;
  }
  builtin_00 = (BuiltIn)type;
  if ((*(int *)(pSStack_30->shadow_arguments).stack_storage.aligned_char == 0) &&
     (*(StorageClass *)((long)AStack_20.aligned_char + 0x90) == StorageClassInput)) {
    if ((local_45 & 1) != MemoryModelSimple >> 0x18) {
      if (((1 < local_44 - BuiltInVertexId) && (1 < local_44 - BuiltInVertexIndex)) &&
         (1 < local_44 - BuiltInBaseVertex)) {
        if (local_44 != BuiltInDrawIndex) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"",&local_c9);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_c9);
          return this;
        }
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar5,"DrawIndex is not supported in MSL.");
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if ((type[0x1c].member_name_cache._M_h._M_element_count & 0x100000000000000) != 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"",local_5d);
        ::std::allocator<char>::~allocator((allocator<char> *)local_5d);
        return this;
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a0," [[",&local_a1);
      builtin_qualifier_abi_cxx11_((CompilerMSL *)&locn,builtin_00);
      ::std::operator+(local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_a0);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)local_80);
      ::std::__cxx11::string::~string((string *)local_80);
      ::std::__cxx11::string::~string((string *)&locn);
      ::std::__cxx11::string::~string(local_a0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      return this;
    }
    if ((local_45 & 1) == MemoryModelSimple >> 0x18) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)AStack_20.aligned_char + 8));
      local_d0 = get_member_location((CompilerMSL *)type,uVar3,execution._4_4_,(uint32_t *)0x0);
    }
    else {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)AStack_20.aligned_char + 8));
      local_d0 = get_or_allocate_builtin_input_member_location
                           ((CompilerMSL *)type,BVar1,uVar3,execution._4_4_,(uint32_t *)0x0);
    }
    if (local_d0 != 0xffffffff) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_110," [[attribute(",&local_111);
      convert_to_string<unsigned_int,_0>(local_138,&local_d0);
      ::std::operator+(local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_110);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)local_f0);
      ::std::__cxx11::string::~string((string *)local_f0);
      ::std::__cxx11::string::~string((string *)local_138);
      ::std::__cxx11::string::~string(local_110);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_111);
      return this;
    }
  }
  bVar2 = is_mesh_shader((CompilerMSL *)type);
  local_8a1 = 1;
  if (!bVar2) {
    bVar2 = is_tese_shader((CompilerMSL *)type);
    local_8a1 = 1;
    if (!bVar2) {
      local_8a2 = 0;
      if (*(int *)(pSStack_30->shadow_arguments).stack_storage.aligned_char == 0) {
        local_8a2 = *(byte *)((long)&type[0x1c].member_name_cache._M_h._M_element_count + 7) ^ 0xff;
      }
      local_8a1 = local_8a2;
    }
  }
  local_139 = local_8a1 & 1;
  if (((*(StorageClass *)((long)AStack_20.aligned_char + 0x90) == StorageClassOutput) ||
      (bVar2 = is_mesh_shader((CompilerMSL *)type), bVar2)) && ((local_139 & 1) != 0)) {
    if ((local_45 & 1) != MemoryModelSimple >> 0x18) {
      if (local_44 != BuiltInPosition) {
        if (local_44 == BuiltInPointSize) {
          local_1a8[0x26] = 0;
          local_1a8[0x25] = 0;
          local_1a9 = 0;
          local_1aa = 0;
          local_1ac = 0;
          if ((type[0x1c].parent_type.id & 1) == 0) {
            ::std::allocator<char>::allocator();
            local_1ac = 1;
            ::std::__cxx11::string::string((string *)this,"",&local_1ab);
          }
          else {
            ::std::allocator<char>::allocator();
            local_1a8[0x26] = 1;
            ::std::__cxx11::string::string(local_180," [[",(allocator *)(local_1a8 + 0x27));
            local_1a8[0x25] = 1;
            builtin_qualifier_abi_cxx11_((CompilerMSL *)local_1a8,builtin_00);
            local_1a9 = 1;
            ::std::operator+(local_160,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_180);
            local_1aa = 1;
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             this,(char *)local_160);
          }
          if ((local_1ac & 1) != 0) {
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1ab);
          }
          if ((local_1aa & 1) != 0) {
            ::std::__cxx11::string::~string((string *)local_160);
          }
          if ((local_1a9 & 1) != 0) {
            ::std::__cxx11::string::~string((string *)local_1a8);
          }
          if ((local_1a8[0x25] & 1) != 0) {
            ::std::__cxx11::string::~string(local_180);
          }
          if ((local_1a8[0x26] & 1) == 0) {
            return this;
          }
          ::std::allocator<char>::~allocator((allocator<char> *)(local_1a8 + 0x27));
          return this;
        }
        if (local_44 == BuiltInClipDistance) {
          local_23c = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)((long)AStack_20.aligned_char + 8));
          bVar2 = Compiler::has_member_decoration
                            ((Compiler *)type,(TypeID)local_23c,execution._4_4_,DecorationIndex);
          if (!bVar2) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_2a8," [[",(allocator *)(local_2d0 + 0x27));
            builtin_qualifier_abi_cxx11_((CompilerMSL *)local_2d0,builtin_00);
            ::std::operator+(local_288,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2a8);
            ::std::operator+(local_268,(char *)local_288);
            VectorView<unsigned_int>::empty(&(pSStack_40->array).super_VectorView<unsigned_int>);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             this,(char *)local_268);
            ::std::__cxx11::string::~string((string *)local_268);
            ::std::__cxx11::string::~string((string *)local_288);
            ::std::__cxx11::string::~string((string *)local_2d0);
            ::std::__cxx11::string::~string(local_2a8);
            ::std::allocator<char>::~allocator((allocator<char> *)(local_2d0 + 0x27));
            return this;
          }
          local_244 = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)((long)AStack_20.aligned_char + 8));
          local_240 = Compiler::get_member_decoration
                                ((Compiler *)type,(TypeID)local_244,execution._4_4_,DecorationIndex)
          ;
          join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                    ((spirv_cross *)this,(char (*) [13])" [[user(clip",&local_240,
                     (char (*) [4])")]]");
          return this;
        }
        if (local_44 == BuiltInCullDistance) {
          local_2d4 = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)((long)AStack_20.aligned_char + 8));
          bVar2 = Compiler::has_member_decoration
                            ((Compiler *)type,(TypeID)local_2d4,execution._4_4_,DecorationIndex);
          if (!bVar2) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_340," [[",(allocator *)(local_368 + 0x27));
            builtin_qualifier_abi_cxx11_((CompilerMSL *)local_368,builtin_00);
            ::std::operator+(local_320,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_340);
            ::std::operator+(local_300,(char *)local_320);
            VectorView<unsigned_int>::empty(&(pSStack_40->array).super_VectorView<unsigned_int>);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             this,(char *)local_300);
            ::std::__cxx11::string::~string((string *)local_300);
            ::std::__cxx11::string::~string((string *)local_320);
            ::std::__cxx11::string::~string((string *)local_368);
            ::std::__cxx11::string::~string(local_340);
            ::std::allocator<char>::~allocator((allocator<char> *)(local_368 + 0x27));
            return this;
          }
          local_2dc = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)((long)AStack_20.aligned_char + 8));
          local_2d8 = Compiler::get_member_decoration
                                ((Compiler *)type,(TypeID)local_2dc,execution._4_4_,DecorationIndex)
          ;
          join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                    ((spirv_cross *)this,(char (*) [13])" [[user(cull",&local_2d8,
                     (char (*) [4])")]]");
          return this;
        }
        if ((local_44 != BuiltInPrimitiveId) && (local_44 != BuiltInLayer)) {
          if (local_44 == BuiltInViewportIndex) {
            bVar2 = Options::supports_msl_version
                              ((Options *)
                               ((long)&type[0x1c].member_type_index_redirection.
                                       super_VectorView<unsigned_int>.ptr + 4),2,0,0);
            if (!bVar2) {
              pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError(pCVar5,"ViewportIndex requires Metal 2.0.");
              __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
          }
          else if ((local_44 != BuiltInPrimitiveShadingRateKHR) &&
                  (local_44 != BuiltInCullPrimitiveEXT)) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)this,"",&local_369);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_369);
            return this;
          }
        }
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_210," [[",(allocator *)(local_238 + 0x27));
      builtin_qualifier_abi_cxx11_((CompilerMSL *)local_238,builtin_00);
      ::std::operator+(local_1f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_210);
      ::std::operator+(local_1d0,(char *)local_1f0);
      VectorView<unsigned_int>::empty(&(pSStack_40->array).super_VectorView<unsigned_int>);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)local_1d0);
      ::std::__cxx11::string::~string((string *)local_1d0);
      ::std::__cxx11::string::~string((string *)local_1f0);
      ::std::__cxx11::string::~string((string *)local_238);
      ::std::__cxx11::string::~string(local_210);
      ::std::allocator<char>::~allocator((allocator<char> *)(local_238 + 0x27));
      return this;
    }
    member_location_attribute_qualifier_abi_cxx11_
              ((CompilerMSL *)local_390,type,AStack_20.aligned_char._0_4_);
    uVar8 = ::std::__cxx11::string::empty();
    bVar2 = (uVar8 & 1) == 0;
    if (bVar2) {
      join<char_const(&)[4],std::__cxx11::string&,char_const(&)[3]>
                ((spirv_cross *)this,(char (*) [4])" [[",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390,
                 (char (*) [3])0x42184a);
    }
    local_394 = (uint)bVar2;
    ::std::__cxx11::string::~string((string *)local_390);
    if (local_394 != 0) {
      return this;
    }
  }
  BVar1 = local_44;
  if (((*(int *)(pSStack_30->shadow_arguments).stack_storage.aligned_char == 0) &&
      ((type[0x1c].member_name_cache._M_h._M_element_count & 0x100000000000000) != 0)) &&
     (*(StorageClass *)((long)AStack_20.aligned_char + 0x90) == StorageClassOutput)) {
    if ((local_45 & 1) != MemoryModelSimple >> 0x18) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)AStack_20.aligned_char + 8));
      get_or_allocate_builtin_output_member_location
                ((CompilerMSL *)type,BVar1,uVar3,execution._4_4_,(uint32_t *)0x0);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"",&local_395);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_395);
    return this;
  }
  bVar2 = is_tesc_shader((CompilerMSL *)type);
  BVar1 = local_44;
  if ((bVar2) && (*(StorageClass *)((long)AStack_20.aligned_char + 0x90) == StorageClassInput)) {
    if ((local_45 & 1) != MemoryModelSimple >> 0x18) {
      switch(local_44) {
      case BuiltInPrimitiveId:
      case BuiltInInvocationId:
        if ((type[0x1c].member_name_cache._M_h._M_element_count & 0x10000000000) != 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"",&local_396);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_396);
          return this;
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_3f8," [[",(allocator *)(local_420 + 0x27));
        builtin_qualifier_abi_cxx11_((CompilerMSL *)local_420,builtin_00);
        ::std::operator+(local_3d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3f8);
        ::std::operator+(local_3b8,(char *)local_3d8);
        VectorView<unsigned_int>::empty(&(pSStack_40->array).super_VectorView<unsigned_int>);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         (char *)local_3b8);
        ::std::__cxx11::string::~string((string *)local_3b8);
        ::std::__cxx11::string::~string((string *)local_3d8);
        ::std::__cxx11::string::~string((string *)local_420);
        ::std::__cxx11::string::~string(local_3f8);
        ::std::allocator<char>::~allocator((allocator<char> *)(local_420 + 0x27));
        return this;
      default:
        break;
      case BuiltInPatchVertices:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"",&local_4b1);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
        return this;
      case BuiltInSubgroupSize:
      case BuiltInSubgroupLocalInvocationId:
        if (((uint)type[0x1c].member_name_cache._M_h._M_rehash_policy._M_max_load_factor & 0x10000)
            != 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"",&local_421);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_421);
          return this;
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_488," [[",&local_489);
        builtin_qualifier_abi_cxx11_((CompilerMSL *)&locn_1,builtin_00);
        ::std::operator+(local_468,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_488);
        ::std::operator+(local_448,(char *)local_468);
        VectorView<unsigned_int>::empty(&(pSStack_40->array).super_VectorView<unsigned_int>);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         (char *)local_448);
        ::std::__cxx11::string::~string((string *)local_448);
        ::std::__cxx11::string::~string((string *)local_468);
        ::std::__cxx11::string::~string((string *)&locn_1);
        ::std::__cxx11::string::~string(local_488);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_489);
        return this;
      }
    }
    if ((type[0x1c].member_name_cache._M_h._M_element_count & 0x10000000000) != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"",&local_4b2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_4b2);
      return this;
    }
    if ((local_45 & 1) == MemoryModelSimple >> 0x18) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)AStack_20.aligned_char + 8));
      local_4b8 = get_member_location((CompilerMSL *)type,uVar3,execution._4_4_,(uint32_t *)0x0);
    }
    else {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)AStack_20.aligned_char + 8));
      local_4b8 = get_or_allocate_builtin_input_member_location
                            ((CompilerMSL *)type,BVar1,uVar3,execution._4_4_,(uint32_t *)0x0);
    }
    if (local_4b8 != 0xffffffff) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_4f8," [[attribute(",&local_4f9);
      convert_to_string<unsigned_int,_0>(local_520,&local_4b8);
      ::std::operator+(local_4d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4f8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)local_4d8);
      ::std::__cxx11::string::~string((string *)local_4d8);
      ::std::__cxx11::string::~string((string *)local_520);
      ::std::__cxx11::string::~string(local_4f8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
      return this;
    }
  }
  bVar2 = is_tesc_shader((CompilerMSL *)type);
  BVar1 = local_44;
  if ((bVar2) && (*(StorageClass *)((long)AStack_20.aligned_char + 0x90) == StorageClassOutput)) {
    if ((local_45 & 1) != MemoryModelSimple >> 0x18) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)AStack_20.aligned_char + 8));
      get_or_allocate_builtin_output_member_location
                ((CompilerMSL *)type,BVar1,uVar3,execution._4_4_,(uint32_t *)0x0);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"",&local_521);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_521);
    return this;
  }
  bVar2 = is_tese_shader((CompilerMSL *)type);
  if ((bVar2) && (*(StorageClass *)((long)AStack_20.aligned_char + 0x90) == StorageClassInput)) {
    if ((local_45 & 1) != MemoryModelSimple >> 0x18) {
      if ((local_44 == BuiltInPrimitiveId) || (local_44 == BuiltInTessCoord)) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_568," [[",(allocator *)(local_590 + 0x27));
        builtin_qualifier_abi_cxx11_((CompilerMSL *)local_590,builtin_00);
        ::std::operator+(local_548,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_568);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         (char *)local_548);
        ::std::__cxx11::string::~string((string *)local_548);
        ::std::__cxx11::string::~string((string *)local_590);
        ::std::__cxx11::string::~string(local_568);
        ::std::allocator<char>::~allocator((allocator<char> *)(local_590 + 0x27));
        return this;
      }
      if (local_44 == BuiltInPatchVertices) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"",&local_591);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_591);
        return this;
      }
    }
    if ((type[0x1c].member_name_cache._M_h._M_element_count & 0x1000000000000) != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"",&local_592);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_592);
      return this;
    }
    pTVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                       ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                        ((long)AStack_20.aligned_char + 0x98),(ulong)execution._4_4_);
    locn_2 = pTVar6->id;
    pSVar7 = Compiler::get_type((Compiler *)type,(TypeID)locn_2);
    BVar1 = local_44;
    if (pSVar7->basetype == ControlPointArray) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"",&local_599);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_599);
      return this;
    }
    if ((local_45 & 1) == MemoryModelSimple >> 0x18) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)AStack_20.aligned_char + 8));
      local_5a0 = get_member_location((CompilerMSL *)type,uVar3,execution._4_4_,(uint32_t *)0x0);
    }
    else {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)AStack_20.aligned_char + 8));
      local_5a0 = get_or_allocate_builtin_input_member_location
                            ((CompilerMSL *)type,BVar1,uVar3,execution._4_4_,(uint32_t *)0x0);
    }
    if (local_5a0 != 0xffffffff) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5e0," [[attribute(",&local_5e1);
      convert_to_string<unsigned_int,_0>(local_608,&local_5a0);
      ::std::operator+(local_5c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5e0);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)local_5c0);
      ::std::__cxx11::string::~string((string *)local_5c0);
      ::std::__cxx11::string::~string((string *)local_608);
      ::std::__cxx11::string::~string(local_5e0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
      return this;
    }
  }
  if ((*(int *)(pSStack_30->shadow_arguments).stack_storage.aligned_char == 4) &&
     (*(StorageClass *)((long)AStack_20.aligned_char + 0x90) == StorageClassInput)) {
    ::std::__cxx11::string::string((string *)(local_648 + 0x20));
    if ((local_45 & 1) == MemoryModelSimple >> 0x18) {
      member_location_attribute_qualifier_abi_cxx11_
                ((CompilerMSL *)local_678,type,AStack_20.aligned_char._0_4_);
      ::std::__cxx11::string::operator=((string *)(local_648 + 0x20),(string *)local_678);
      ::std::__cxx11::string::~string((string *)local_678);
      goto LAB_002ee498;
    }
    if (local_44 == BuiltInClipDistance) {
      local_678._40_4_ =
           TypedID::operator_cast_to_TypedID((TypedID *)((long)AStack_20.aligned_char + 8));
      local_678._44_4_ =
           Compiler::get_member_decoration
                     ((Compiler *)type,(TypeID)local_678._40_4_,execution._4_4_,DecorationIndex);
      join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                ((spirv_cross *)this,(char (*) [13])" [[user(clip",(uint *)(local_678 + 0x2c),
                 (char (*) [4])")]]");
      local_394 = 1;
    }
    else if (local_44 == BuiltInCullDistance) {
      local_678._32_4_ =
           TypedID::operator_cast_to_TypedID((TypedID *)((long)AStack_20.aligned_char + 8));
      local_678._36_4_ =
           Compiler::get_member_decoration
                     ((Compiler *)type,(TypeID)local_678._32_4_,execution._4_4_,DecorationIndex);
      join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                ((spirv_cross *)this,(char (*) [13])" [[user(cull",(uint *)(local_678 + 0x24),
                 (char (*) [4])")]]");
      local_394 = 1;
    }
    else {
      if (((local_44 == BuiltInLayer) || (local_44 - BuiltInFragCoord < 4)) ||
         (local_44 == BuiltInSampleMask)) {
LAB_002ee30a:
        builtin_qualifier_abi_cxx11_((CompilerMSL *)local_648,builtin_00);
        ::std::__cxx11::string::operator=((string *)(local_648 + 0x20),(string *)local_648);
        ::std::__cxx11::string::~string((string *)local_648);
      }
      else if (local_44 == BuiltInViewIndex) {
        if ((((ulong)type[0x1c].member_name_cache._M_h._M_buckets & 0x1000000) != 0) &&
           (((ulong)type[0x1c].member_name_cache._M_h._M_buckets & 0x100000000) != 0))
        goto LAB_002ee30a;
      }
      else if (local_44 - BuiltInBaryCoordKHR < 2) goto LAB_002ee30a;
LAB_002ee498:
      local_995 = false;
      if (local_44 == BuiltInBaryCoordKHR) {
        local_67c = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)((long)AStack_20.aligned_char + 8))
        ;
        local_995 = Compiler::has_member_decoration
                              ((Compiler *)type,(TypeID)local_67c,execution._4_4_,
                               DecorationNoPerspective);
      }
      if (local_995 != false) {
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar5,"NoPerspective decorations are not supported for BaryCoord inputs.");
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      bVar2 = type_is_integral(pSStack_40);
      if ((!bVar2) &&
         (((local_45 & 1) == MemoryModelSimple >> 0x18 || (local_44 != BuiltInFragCoord)))) {
        local_680 = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)((long)AStack_20.aligned_char + 8))
        ;
        bVar2 = Compiler::has_member_decoration
                          ((Compiler *)type,(TypeID)local_680,execution._4_4_,DecorationFlat);
        if (bVar2) {
          uVar8 = ::std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
            ::std::__cxx11::string::operator+=((string *)(local_648 + 0x20),", ");
          }
          ::std::__cxx11::string::operator+=((string *)(local_648 + 0x20),"flat");
        }
        else {
          local_684 = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)((long)AStack_20.aligned_char + 8));
          bVar2 = Compiler::has_member_decoration
                            ((Compiler *)type,(TypeID)local_684,execution._4_4_,DecorationCentroid);
          if (bVar2) {
            uVar8 = ::std::__cxx11::string::empty();
            if ((uVar8 & 1) == 0) {
              ::std::__cxx11::string::operator+=((string *)(local_648 + 0x20),", ");
            }
            if ((local_44 == BuiltInBaryCoordNoPerspKHR) || (local_44 == BuiltInBaryCoordKHR)) {
              pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (pCVar5,"Centroid interpolation not supported for barycentrics in MSL.");
              __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            local_688 = (uint32_t)
                        TypedID::operator_cast_to_TypedID
                                  ((TypedID *)((long)AStack_20.aligned_char + 8));
            bVar2 = Compiler::has_member_decoration
                              ((Compiler *)type,(TypeID)local_688,execution._4_4_,
                               DecorationNoPerspective);
            if (bVar2) {
              ::std::__cxx11::string::operator+=
                        ((string *)(local_648 + 0x20),"centroid_no_perspective");
            }
            else {
              ::std::__cxx11::string::operator+=
                        ((string *)(local_648 + 0x20),"centroid_perspective");
            }
          }
          else {
            local_68c = (uint32_t)
                        TypedID::operator_cast_to_TypedID
                                  ((TypedID *)((long)AStack_20.aligned_char + 8));
            bVar2 = Compiler::has_member_decoration
                              ((Compiler *)type,(TypeID)local_68c,execution._4_4_,DecorationSample);
            if (bVar2) {
              uVar8 = ::std::__cxx11::string::empty();
              if ((uVar8 & 1) == 0) {
                ::std::__cxx11::string::operator+=((string *)(local_648 + 0x20),", ");
              }
              if ((local_44 == BuiltInBaryCoordNoPerspKHR) || (local_44 == BuiltInBaryCoordKHR)) {
                pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
                CompilerError::CompilerError
                          (pCVar5,"Sample interpolation not supported for barycentrics in MSL.");
                __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
              }
              local_690 = (uint32_t)
                          TypedID::operator_cast_to_TypedID
                                    ((TypedID *)((long)AStack_20.aligned_char + 8));
              bVar2 = Compiler::has_member_decoration
                                ((Compiler *)type,(TypeID)local_690,execution._4_4_,
                                 DecorationNoPerspective);
              if (bVar2) {
                ::std::__cxx11::string::operator+=
                          ((string *)(local_648 + 0x20),"sample_no_perspective");
              }
              else {
                ::std::__cxx11::string::operator+=
                          ((string *)(local_648 + 0x20),"sample_perspective");
              }
            }
            else {
              local_694 = (uint32_t)
                          TypedID::operator_cast_to_TypedID
                                    ((TypedID *)((long)AStack_20.aligned_char + 8));
              local_9ee = Compiler::has_member_decoration
                                    ((Compiler *)type,(TypeID)local_694,execution._4_4_,
                                     DecorationNoPerspective);
              local_9ee = local_9ee || local_44 == BuiltInBaryCoordNoPerspKHR;
              if (local_9ee) {
                uVar8 = ::std::__cxx11::string::empty();
                if ((uVar8 & 1) == 0) {
                  ::std::__cxx11::string::operator+=((string *)(local_648 + 0x20),", ");
                }
                ::std::__cxx11::string::operator+=
                          ((string *)(local_648 + 0x20),"center_no_perspective");
              }
              else if (local_44 == BuiltInBaryCoordKHR) {
                uVar8 = ::std::__cxx11::string::empty();
                if ((uVar8 & 1) == 0) {
                  ::std::__cxx11::string::operator+=((string *)(local_648 + 0x20),", ");
                }
                ::std::__cxx11::string::operator+=
                          ((string *)(local_648 + 0x20),"center_perspective");
              }
            }
          }
        }
      }
      uVar8 = ::std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        ::std::operator+((char *)local_6b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" [[")
        ;
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         (char *)local_6b8);
        ::std::__cxx11::string::~string(local_6b8);
        local_394 = 1;
      }
      else {
        local_394 = 0;
      }
    }
    ::std::__cxx11::string::~string((string *)(local_648 + 0x20));
    if (local_394 != 0) {
      return this;
    }
  }
  if ((*(int *)(pSStack_30->shadow_arguments).stack_storage.aligned_char == 4) &&
     (*(StorageClass *)((long)AStack_20.aligned_char + 0x90) == StorageClassOutput)) {
    if ((local_45 & 1) != MemoryModelSimple >> 0x18) {
      if (local_44 != BuiltInSampleMask) {
        if (local_44 != BuiltInFragDepth) {
          if (local_44 != BuiltInFragStencilRefEXT) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)this,"",&local_799);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_799);
            return this;
          }
          if ((type[0x1c].parent_type.id & 0x10000) == 0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)this,"",&local_6b9);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
            return this;
          }
          bVar2 = Options::supports_msl_version
                            ((Options *)
                             ((long)&type[0x1c].member_type_index_redirection.
                                     super_VectorView<unsigned_int>.ptr + 4),2,1,0);
          if (bVar2) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_700," [[",(allocator *)(local_728 + 0x27));
            builtin_qualifier_abi_cxx11_((CompilerMSL *)local_728,builtin_00);
            ::std::operator+(local_6e0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_700);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             this,(char *)local_6e0);
            ::std::__cxx11::string::~string((string *)local_6e0);
            ::std::__cxx11::string::~string((string *)local_728);
            ::std::__cxx11::string::~string(local_700);
            ::std::allocator<char>::~allocator((allocator<char> *)(local_728 + 0x27));
            return this;
          }
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar5,"Stencil export only supported in MSL 2.1 and up.");
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if ((type[0x1c].parent_type.id & 0x100) == 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"",&local_729);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_729);
          return this;
        }
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_770," [[",&local_771);
      builtin_qualifier_abi_cxx11_((CompilerMSL *)&locn_3,builtin_00);
      ::std::operator+(local_750,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_770);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)local_750);
      ::std::__cxx11::string::~string((string *)local_750);
      ::std::__cxx11::string::~string((string *)&locn_3);
      ::std::__cxx11::string::~string(local_770);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_771);
      return this;
    }
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)AStack_20.aligned_char + 8));
    local_7a0 = get_member_location((CompilerMSL *)type,uVar3,execution._4_4_,(uint32_t *)0x0);
    if ((local_7a0 != 0xffffffff) &&
       ((type[0x1c].image.access & 1 << ((byte)local_7a0 & 0x1f)) == AccessQualifierReadOnly)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"",&local_7a1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
      return this;
    }
    local_a31 = false;
    if (local_7a0 != 0xffffffff) {
      local_7a8 = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)((long)AStack_20.aligned_char + 8));
      local_a31 = Compiler::has_member_decoration
                            ((Compiler *)type,(TypeID)local_7a8,execution._4_4_,DecorationIndex);
    }
    if (local_a31 == false) {
      if (local_7a0 != 0xffffffff) {
        join<char_const(&)[10],unsigned_int&,char_const(&)[4]>
                  ((spirv_cross *)this,(char (*) [10])" [[color(",&local_7a0,(char (*) [4])")]]");
        return this;
      }
      local_7b4 = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)((long)AStack_20.aligned_char + 8));
      bVar2 = Compiler::has_member_decoration
                        ((Compiler *)type,(TypeID)local_7b4,execution._4_4_,DecorationIndex);
      if (!bVar2) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"",&local_7bd);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_7bd);
        return this;
      }
      local_7bc = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)((long)AStack_20.aligned_char + 8));
      local_7b8 = Compiler::get_member_decoration
                            ((Compiler *)type,(TypeID)local_7bc,execution._4_4_,DecorationIndex);
      join<char_const(&)[10],unsigned_int,char_const(&)[4]>
                ((spirv_cross *)this,(char (*) [10])" [[index(",&local_7b8,(char (*) [4])")]]");
      return this;
    }
    local_7b0 = (uint32_t)
                TypedID::operator_cast_to_TypedID((TypedID *)((long)AStack_20.aligned_char + 8));
    local_7ac = Compiler::get_member_decoration
                          ((Compiler *)type,(TypeID)local_7b0,execution._4_4_,DecorationIndex);
    join<char_const(&)[10],unsigned_int&,char_const(&)[10],unsigned_int,char_const(&)[4]>
              ((spirv_cross *)this,(char (*) [10])" [[color(",&local_7a0,(char (*) [10])"), index(",
               &local_7ac,(char (*) [4])")]]");
    return this;
  }
  if (((*(int *)(pSStack_30->shadow_arguments).stack_storage.aligned_char == 5) &&
      (*(StorageClass *)((long)AStack_20.aligned_char + 0x90) == StorageClassInput)) &&
     ((local_45 & 1) != MemoryModelSimple >> 0x18)) {
    if ((local_44 != BuiltInNumWorkgroups) && (3 < local_44 - BuiltInWorkgroupId)) {
      if ((local_44 != BuiltInSubgroupSize) &&
         ((local_44 != BuiltInNumSubgroups &&
          (local_44 != BuiltInSubgroupId && local_44 != BuiltInSubgroupLocalInvocationId)))) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"",&local_829);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_829);
        return this;
      }
      if (((uint)type[0x1c].member_name_cache._M_h._M_rehash_policy._M_max_load_factor & 0x10000) !=
          0) goto LAB_002ef3a4;
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_800," [[",(allocator *)(local_828 + 0x27));
    builtin_qualifier_abi_cxx11_((CompilerMSL *)local_828,builtin_00);
    ::std::operator+(local_7e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_800)
    ;
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)local_7e0);
    ::std::__cxx11::string::~string((string *)local_7e0);
    ::std::__cxx11::string::~string((string *)local_828);
    ::std::__cxx11::string::~string(local_800);
    ::std::allocator<char>::~allocator((allocator<char> *)(local_828 + 0x27));
  }
  else {
LAB_002ef3a4:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"",&local_82a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_82a);
  }
  return this;
}

Assistant:

string CompilerMSL::member_attribute_qualifier(const SPIRType &type, uint32_t index)
{
	auto &execution = get_entry_point();

	uint32_t mbr_type_id = type.member_types[index];
	auto &mbr_type = get<SPIRType>(mbr_type_id);

	BuiltIn builtin = BuiltInMax;
	bool is_builtin = is_member_builtin(type, index, &builtin);

	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary))
	{
		string quals = join(
		    " [[id(", get_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary), ")");
		if (interlocked_resources.count(
		        get_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID)))
			quals += ", raster_order_group(0)";
		quals += "]]";
		return quals;
	}

	// Vertex function inputs
	if (execution.model == ExecutionModelVertex && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInVertexId:
			case BuiltInVertexIndex:
			case BuiltInBaseVertex:
			case BuiltInInstanceId:
			case BuiltInInstanceIndex:
			case BuiltInBaseInstance:
				if (msl_options.vertex_for_tessellation)
					return "";
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			case BuiltInDrawIndex:
				SPIRV_CROSS_THROW("DrawIndex is not supported in MSL.");

			default:
				return "";
			}
		}

		uint32_t locn;
		if (is_builtin)
			locn = get_or_allocate_builtin_input_member_location(builtin, type.self, index);
		else
			locn = get_member_location(type.self, index);

		if (locn != k_unknown_location)
			return string(" [[attribute(") + convert_to_string(locn) + ")]]";
	}

	bool use_semantic_stage_output = is_mesh_shader() || is_tese_shader() ||
	                                 (execution.model == ExecutionModelVertex && !msl_options.vertex_for_tessellation);

	// Vertex, mesh and tessellation evaluation function outputs
	if ((type.storage == StorageClassOutput || is_mesh_shader()) && use_semantic_stage_output)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInPointSize:
				// Only mark the PointSize builtin if really rendering points.
				// Some shaders may include a PointSize builtin even when used to render
				// non-point topologies, and Metal will reject this builtin when compiling
				// the shader into a render pipeline that uses a non-point topology.
				return msl_options.enable_point_size_builtin ? (string(" [[") + builtin_qualifier(builtin) + "]]") : "";

			case BuiltInViewportIndex:
				if (!msl_options.supports_msl_version(2, 0))
					SPIRV_CROSS_THROW("ViewportIndex requires Metal 2.0.");
				/* fallthrough */
			case BuiltInPosition:
			case BuiltInLayer:
			case BuiltInCullPrimitiveEXT:
			case BuiltInPrimitiveShadingRateKHR:
			case BuiltInPrimitiveId:
				return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");

			case BuiltInClipDistance:
				if (has_member_decoration(type.self, index, DecorationIndex))
					return join(" [[user(clip", get_member_decoration(type.self, index, DecorationIndex), ")]]");
				else
					return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");

			case BuiltInCullDistance:
				if (has_member_decoration(type.self, index, DecorationIndex))
					return join(" [[user(cull", get_member_decoration(type.self, index, DecorationIndex), ")]]");
				else
					return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");

			default:
				return "";
			}
		}
		string loc_qual = member_location_attribute_qualifier(type, index);
		if (!loc_qual.empty())
			return join(" [[", loc_qual, "]]");
	}

	if (execution.model == ExecutionModelVertex && msl_options.vertex_for_tessellation && type.storage == StorageClassOutput)
	{
		// For this type of shader, we always arrange for it to capture its
		// output to a buffer. For this reason, qualifiers are irrelevant here.
		if (is_builtin)
			// We still have to assign a location so the output struct will sort correctly.
			get_or_allocate_builtin_output_member_location(builtin, type.self, index);
		return "";
	}

	// Tessellation control function inputs
	if (is_tesc_shader() && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInInvocationId:
			case BuiltInPrimitiveId:
				if (msl_options.multi_patch_workgroup)
					return "";
				return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");
			case BuiltInSubgroupLocalInvocationId: // FIXME: Should work in any stage
			case BuiltInSubgroupSize: // FIXME: Should work in any stage
				if (msl_options.emulate_subgroups)
					return "";
				return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");
			case BuiltInPatchVertices:
				return "";
			// Others come from stage input.
			default:
				break;
			}
		}
		if (msl_options.multi_patch_workgroup)
			return "";

		uint32_t locn;
		if (is_builtin)
			locn = get_or_allocate_builtin_input_member_location(builtin, type.self, index);
		else
			locn = get_member_location(type.self, index);

		if (locn != k_unknown_location)
			return string(" [[attribute(") + convert_to_string(locn) + ")]]";
	}

	// Tessellation control function outputs
	if (is_tesc_shader() && type.storage == StorageClassOutput)
	{
		// For this type of shader, we always arrange for it to capture its
		// output to a buffer. For this reason, qualifiers are irrelevant here.
		if (is_builtin)
			// We still have to assign a location so the output struct will sort correctly.
			get_or_allocate_builtin_output_member_location(builtin, type.self, index);
		return "";
	}

	// Tessellation evaluation function inputs
	if (is_tese_shader() && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInPrimitiveId:
			case BuiltInTessCoord:
				return string(" [[") + builtin_qualifier(builtin) + "]]";
			case BuiltInPatchVertices:
				return "";
			// Others come from stage input.
			default:
				break;
			}
		}

		if (msl_options.raw_buffer_tese_input)
			return "";

		// The special control point array must not be marked with an attribute.
		if (get_type(type.member_types[index]).basetype == SPIRType::ControlPointArray)
			return "";

		uint32_t locn;
		if (is_builtin)
			locn = get_or_allocate_builtin_input_member_location(builtin, type.self, index);
		else
			locn = get_member_location(type.self, index);

		if (locn != k_unknown_location)
			return string(" [[attribute(") + convert_to_string(locn) + ")]]";
	}

	// Tessellation evaluation function outputs were handled above.

	// Fragment function inputs
	if (execution.model == ExecutionModelFragment && type.storage == StorageClassInput)
	{
		string quals;
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInViewIndex:
				if (!msl_options.multiview || !msl_options.multiview_layered_rendering)
					break;
				/* fallthrough */
			case BuiltInFrontFacing:
			case BuiltInPointCoord:
			case BuiltInFragCoord:
			case BuiltInSampleId:
			case BuiltInSampleMask:
			case BuiltInLayer:
			case BuiltInBaryCoordKHR:
			case BuiltInBaryCoordNoPerspKHR:
				quals = builtin_qualifier(builtin);
				break;

			case BuiltInClipDistance:
				return join(" [[user(clip", get_member_decoration(type.self, index, DecorationIndex), ")]]");
			case BuiltInCullDistance:
				return join(" [[user(cull", get_member_decoration(type.self, index, DecorationIndex), ")]]");

			default:
				break;
			}
		}
		else
			quals = member_location_attribute_qualifier(type, index);

		if (builtin == BuiltInBaryCoordKHR && has_member_decoration(type.self, index, DecorationNoPerspective))
		{
			// NoPerspective is baked into the builtin type.
			SPIRV_CROSS_THROW("NoPerspective decorations are not supported for BaryCoord inputs.");
		}

		// Don't bother decorating integers with the 'flat' attribute; it's
		// the default (in fact, the only option). Also don't bother with the
		// FragCoord builtin; it's always noperspective on Metal.
		if (!type_is_integral(mbr_type) && (!is_builtin || builtin != BuiltInFragCoord))
		{
			if (has_member_decoration(type.self, index, DecorationFlat))
			{
				if (!quals.empty())
					quals += ", ";
				quals += "flat";
			}
			else if (has_member_decoration(type.self, index, DecorationCentroid))
			{
				if (!quals.empty())
					quals += ", ";

				if (builtin == BuiltInBaryCoordNoPerspKHR || builtin == BuiltInBaryCoordKHR)
					SPIRV_CROSS_THROW("Centroid interpolation not supported for barycentrics in MSL.");

				if (has_member_decoration(type.self, index, DecorationNoPerspective))
					quals += "centroid_no_perspective";
				else
					quals += "centroid_perspective";
			}
			else if (has_member_decoration(type.self, index, DecorationSample))
			{
				if (!quals.empty())
					quals += ", ";

				if (builtin == BuiltInBaryCoordNoPerspKHR || builtin == BuiltInBaryCoordKHR)
					SPIRV_CROSS_THROW("Sample interpolation not supported for barycentrics in MSL.");

				if (has_member_decoration(type.self, index, DecorationNoPerspective))
					quals += "sample_no_perspective";
				else
					quals += "sample_perspective";
			}
			else if (has_member_decoration(type.self, index, DecorationNoPerspective) || builtin == BuiltInBaryCoordNoPerspKHR)
			{
				if (!quals.empty())
					quals += ", ";
				quals += "center_no_perspective";
			}
			else if (builtin == BuiltInBaryCoordKHR)
			{
				if (!quals.empty())
					quals += ", ";
				quals += "center_perspective";
			}
		}

		if (!quals.empty())
			return " [[" + quals + "]]";
	}

	// Fragment function outputs
	if (execution.model == ExecutionModelFragment && type.storage == StorageClassOutput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInFragStencilRefEXT:
				// Similar to PointSize, only mark FragStencilRef if there's a stencil buffer.
				// Some shaders may include a FragStencilRef builtin even when used to render
				// without a stencil attachment, and Metal will reject this builtin
				// when compiling the shader into a render pipeline that does not set
				// stencilAttachmentPixelFormat.
				if (!msl_options.enable_frag_stencil_ref_builtin)
					return "";
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Stencil export only supported in MSL 2.1 and up.");
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			case BuiltInFragDepth:
				// Ditto FragDepth.
				if (!msl_options.enable_frag_depth_builtin)
					return "";
				/* fallthrough */
			case BuiltInSampleMask:
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			default:
				return "";
			}
		}
		uint32_t locn = get_member_location(type.self, index);
		// Metal will likely complain about missing color attachments, too.
		if (locn != k_unknown_location && !(msl_options.enable_frag_output_mask & (1 << locn)))
			return "";
		if (locn != k_unknown_location && has_member_decoration(type.self, index, DecorationIndex))
			return join(" [[color(", locn, "), index(", get_member_decoration(type.self, index, DecorationIndex),
			            ")]]");
		else if (locn != k_unknown_location)
			return join(" [[color(", locn, ")]]");
		else if (has_member_decoration(type.self, index, DecorationIndex))
			return join(" [[index(", get_member_decoration(type.self, index, DecorationIndex), ")]]");
		else
			return "";
	}

	// Compute function inputs
	if (execution.model == ExecutionModelGLCompute && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInNumSubgroups:
			case BuiltInSubgroupId:
			case BuiltInSubgroupLocalInvocationId: // FIXME: Should work in any stage
			case BuiltInSubgroupSize: // FIXME: Should work in any stage
				if (msl_options.emulate_subgroups)
					break;
				/* fallthrough */
			case BuiltInGlobalInvocationId:
			case BuiltInWorkgroupId:
			case BuiltInNumWorkgroups:
			case BuiltInLocalInvocationId:
			case BuiltInLocalInvocationIndex:
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			default:
				return "";
			}
		}
	}

	return "";
}